

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask25_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x19 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 7;
  *puVar1 = in[2] << 0x12 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] >> 0xe;
  *puVar1 = in[3] << 0xb | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[3] >> 0x15;
  *puVar1 = in[4] << 4 | *puVar1;
  *puVar1 = in[5] << 0x1d | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[5] >> 3;
  *puVar1 = in[6] << 0x16 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[6] >> 10;
  *puVar1 = in[7] << 0xf | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[7] >> 0x11;
  *puVar1 = in[8] << 8 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[8] >> 0x18;
  *puVar1 = in[9] << 1 | *puVar1;
  *puVar1 = in[10] << 0x1a | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[10] >> 6;
  *puVar1 = in[0xb] << 0x13 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0xb] >> 0xd;
  *puVar1 = in[0xc] << 0xc | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0xc] >> 0x14;
  *puVar1 = in[0xd] << 5 | *puVar1;
  *puVar1 = in[0xe] << 0x1e | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[0xe] >> 2;
  *puVar1 = in[0xf] << 0x17 | *puVar1;
  out[0xc] = in[0xf] >> 9;
  return out + 0xd;
}

Assistant:

uint32_t *__fastpackwithoutmask25_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (25 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (25 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (25 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (25 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (25 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (25 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (25 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (25 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (25 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (25 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (25 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (25 - 16);
  ++in;

  return out + 1;
}